

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O1

void jsons_print_augment(lyout *out,lys_node_augment *aug,uint8_t aug_size,int *first)

{
  undefined7 in_register_00000011;
  char *pcVar1;
  long lVar2;
  int local_34 [2];
  int f;
  
  if ((int)CONCAT71(in_register_00000011,aug_size) != 0) {
    ly_print(out,"%s\"augment\":{",",");
    lVar2 = 0;
    do {
      pcVar1 = ",";
      if (lVar2 == 0) {
        pcVar1 = "";
      }
      ly_print(out,"%s\"%s\":{",pcVar1,*(undefined8 *)(aug->padding + lVar2 + -0x1c));
      local_34[0] = 1;
      jsons_print_text(out,"description","text",*(char **)(aug->padding + lVar2 + -0x14),1,local_34)
      ;
      jsons_print_text(out,"reference","text",*(char **)(aug->padding + lVar2 + -0xc),1,local_34);
      jsons_print_status(out,*(uint16_t *)(aug->padding + lVar2 + -4),local_34);
      jsons_print_iffeatures
                (out,*(lys_module **)(aug->padding + lVar2 + 0x14),
                 *(lys_iffeature **)(aug->padding + lVar2 + 0xc),aug->padding[lVar2 + -1],local_34);
      jsons_print_when(out,*(lys_when **)(aug->padding + lVar2 + 0x34),local_34);
      jsons_print_data(out,aug->module,aug->child,local_34);
      jsons_print_nodes_(out,aug->child,"actions",0x4000,local_34);
      jsons_print_nodes_(out,aug->child,"notifications",0x80,local_34);
      ly_print(out,"}");
      lVar2 = lVar2 + 0x68;
    } while ((ulong)aug_size * 0x68 != lVar2);
    ly_print(out,"}");
  }
  return;
}

Assistant:

static void
jsons_print_augment(struct lyout *out, const struct lys_node_augment *aug, uint8_t aug_size, int *first)
{
    int i, f;

    if (!aug_size) {
        return;
    }

    ly_print(out, "%s\"augment\":{", (first && (*first)) ? "" : ",");
    for (i = 0; i < aug_size; ++i) {
        ly_print(out, "%s\"%s\":{", i ? "," : "", aug[i].target_name);
        f = 1;
        jsons_print_text(out, "description", "text", aug[i].dsc, 1, &f);
        jsons_print_text(out, "reference", "text", aug[i].ref, 1, &f);
        jsons_print_status(out, aug[i].flags, &f);
        jsons_print_iffeatures(out, aug[i].module, aug[i].iffeature, aug[i].iffeature_size, &f);
        jsons_print_when(out, aug[i].when, &f);
        jsons_print_data(out, aug->module, aug->child, &f);
        jsons_print_actions(out, aug->child, &f);
        jsons_print_notifs(out, aug->child, &f);
        ly_print(out, "}");
    }
    ly_print(out, "}");
    if (first) {
        (*first) = 0;
    }

    if (first) {
        ly_print(out, "\n");
    }
}